

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O0

int match1by1(Abc_Ntk_t *pNtk1,Vec_Ptr_t **nodesInLevel1,Vec_Int_t **iMatch1,Vec_Int_t **iDep1,
             Vec_Int_t *matchedInputs1,int *iGroup1,Vec_Int_t **oMatch1,int *oGroup1,
             Abc_Ntk_t *pNtk2,Vec_Ptr_t **nodesInLevel2,Vec_Int_t **iMatch2,Vec_Int_t **iDep2,
             Vec_Int_t *matchedInputs2,int *iGroup2,Vec_Int_t **oMatch2,int *oGroup2,
             Vec_Int_t *matchedOutputs1,Vec_Int_t *matchedOutputs2,Vec_Int_t *oMatchedGroups,
             Vec_Int_t *iNonSingleton,int ii,int idx)

{
  Vec_Int_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  int *piVar3;
  Abc_Ntk_t *pNtk;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Abc_Obj_t *pAVar9;
  void *__ptr;
  int local_104;
  int local_100;
  int n_2;
  int n_1;
  int n;
  int *suppNum2;
  Abc_Obj_t *pAStack_e8;
  int suppNum1;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vSupp;
  Vec_Int_t *currInputs2;
  Vec_Int_t *currInputs1;
  int *bitVector2;
  int *bitVector1;
  Abc_Ntk_t *FpNtk2;
  Abc_Ntk_t *FpNtk1;
  Vec_Int_t *mismatch;
  int tempJ;
  int i;
  int m;
  int j;
  int *skipList;
  Vec_Ptr_t *oMatchPairs;
  Vec_Int_t *oNonSingleton;
  Abc_Ntk_t *subNtk2;
  Abc_Ntk_t *subNtk1;
  int *iGroup1_local;
  Vec_Int_t *matchedInputs1_local;
  Vec_Int_t **iDep1_local;
  Vec_Int_t **iMatch1_local;
  Vec_Ptr_t **nodesInLevel1_local;
  Abc_Ntk_t *pNtk1_local;
  
  match1by1::MATCH_FOUND = 0;
  subNtk1 = (Abc_Ntk_t *)iGroup1;
  iGroup1_local = &matchedInputs1->nCap;
  matchedInputs1_local = (Vec_Int_t *)iDep1;
  iDep1_local = iMatch1;
  iMatch1_local = (Vec_Int_t **)nodesInLevel1;
  nodesInLevel1_local = (Vec_Ptr_t **)pNtk1;
  iVar4 = Vec_IntSize(iNonSingleton);
  if (ii == iVar4) {
    match1by1::MATCH_FOUND = 1;
    pNtk1_local._4_4_ = 1;
  }
  else {
    mismatch._4_4_ = Vec_IntEntry(iNonSingleton,ii);
    iVar4 = Vec_IntSize(iDep1_local[mismatch._4_4_]);
    if (idx == iVar4) {
      pNtk1_local._4_4_ =
           match1by1((Abc_Ntk_t *)nodesInLevel1_local,(Vec_Ptr_t **)iMatch1_local,iDep1_local,
                     (Vec_Int_t **)matchedInputs1_local,(Vec_Int_t *)iGroup1_local,(int *)subNtk1,
                     oMatch1,oGroup1,pNtk2,nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup2,
                     oMatch2,oGroup2,matchedOutputs1,matchedOutputs2,oMatchedGroups,iNonSingleton,
                     ii + 1,0);
    }
    else {
      oMatchPairs = (Vec_Ptr_t *)Vec_IntAlloc(10);
      skipList = &Vec_PtrAlloc(100)->nCap;
      iVar4 = Vec_IntSize(iDep1_local[mismatch._4_4_]);
      _m = malloc((long)iVar4 << 2);
      for (i = 0; iVar4 = i, iVar5 = Vec_IntSize(iDep1_local[mismatch._4_4_]),
          piVar3 = iGroup1_local, iVar4 < iVar5; i = i + 1) {
        *(undefined4 *)((long)_m + (long)i * 4) = 0;
      }
      iVar4 = Vec_IntEntry(iDep1_local[mismatch._4_4_],idx);
      Vec_IntPush((Vec_Int_t *)piVar3,iVar4);
      iVar4 = idx + 1;
      if (iVar4 == 1) {
        i = 0;
        while( true ) {
          pVVar1 = matchedInputs1_local;
          iVar5 = i;
          iVar6 = Vec_IntEntryLast(iDep1_local[mismatch._4_4_]);
          iVar6 = Vec_IntSize(*(Vec_Int_t **)(&pVVar1->nCap + (long)iVar6 * 2));
          pVVar1 = matchedInputs1_local;
          if (iVar6 <= iVar5) break;
          iVar5 = Vec_IntEntryLast(iDep1_local[mismatch._4_4_]);
          iVar5 = Vec_IntEntry(*(Vec_Int_t **)(&pVVar1->nCap + (long)iVar5 * 2),i);
          iVar5 = Vec_IntSize(oMatch1[oGroup1[iVar5]]);
          pVVar1 = matchedInputs1_local;
          if (iVar5 != 1) {
            iVar5 = Vec_IntEntryLast(iDep1_local[mismatch._4_4_]);
            iVar5 = Vec_IntEntry(*(Vec_Int_t **)(&pVVar1->nCap + (long)iVar5 * 2),i);
            iVar5 = Vec_IntFind(oMatchedGroups,oGroup1[iVar5]);
            pVVar1 = matchedInputs1_local;
            pVVar2 = oMatchPairs;
            if (iVar5 == -1) {
              iVar5 = Vec_IntEntryLast(iDep1_local[mismatch._4_4_]);
              iVar5 = Vec_IntEntry(*(Vec_Int_t **)(&pVVar1->nCap + (long)iVar5 * 2),i);
              Vec_IntPushUnique((Vec_Int_t *)pVVar2,oGroup1[iVar5]);
              pVVar1 = matchedInputs1_local;
              iVar5 = Vec_IntEntryLast(iDep1_local[mismatch._4_4_]);
              iVar5 = Vec_IntEntry(*(Vec_Int_t **)(&pVVar1->nCap + (long)iVar5 * 2),i);
              Vec_IntPushUnique(oMatchedGroups,oGroup1[iVar5]);
            }
          }
          i = i + 1;
        }
      }
      subNtk2 = computeCofactor((Abc_Ntk_t *)nodesInLevel1_local,(Vec_Ptr_t **)iMatch1_local,
                                (int *)0x0,(Vec_Int_t *)iGroup1_local);
      for (i = idx; iVar5 = i, iVar6 = Vec_IntSize(iMatch2[mismatch._4_4_]),
          iVar5 < iVar6 && match1by1::MATCH_FOUND == 0; i = i + 1) {
        if (*(int *)((long)_m + (long)i * 4) == 0) {
          FpNtk1 = (Abc_Ntk_t *)Vec_IntAlloc(10);
          iVar5 = Vec_IntEntry(iMatch2[mismatch._4_4_],i);
          Vec_IntPush(matchedInputs2,iVar5);
          oNonSingleton =
               (Vec_Int_t *)computeCofactor(pNtk2,nodesInLevel2,(int *)0x0,matchedInputs2);
          for (tempJ = 0; iVar5 = tempJ, iVar6 = Vec_IntSize(matchedOutputs1), pNtk = subNtk2,
              piVar3 = skipList, iVar5 < iVar6; tempJ = tempJ + 1) {
            iVar5 = Vec_IntEntry(matchedOutputs1,tempJ);
            pAVar9 = Abc_NtkPo(pNtk,iVar5);
            Vec_PtrPush((Vec_Ptr_t *)piVar3,pAVar9);
            pVVar1 = oNonSingleton;
            piVar3 = skipList;
            iVar5 = Vec_IntEntry(matchedOutputs2,tempJ);
            pAVar9 = Abc_NtkPo((Abc_Ntk_t *)pVVar1,iVar5);
            Vec_PtrPush((Vec_Ptr_t *)piVar3,pAVar9);
          }
          match1by1::counter = match1by1::counter + 1;
          iVar5 = Abc_NtkBmSat((Abc_Ntk_t *)oNonSingleton,subNtk2,(Vec_Ptr_t *)0x0,
                               (Vec_Ptr_t *)skipList,(Vec_Int_t *)FpNtk1,0);
          if (iVar5 == 0) {
            suppNum2._4_4_ = 0;
            iVar5 = Abc_NtkPiNum((Abc_Ntk_t *)nodesInLevel1_local);
            bitVector2 = (int *)malloc((long)iVar5 << 2);
            iVar5 = Abc_NtkPiNum(pNtk2);
            currInputs1 = (Vec_Int_t *)malloc((long)iVar5 << 2);
            currInputs2 = Vec_IntAlloc(10);
            vSupp = (Vec_Ptr_t *)Vec_IntAlloc(10);
            iVar5 = Vec_IntSize(iMatch2[mismatch._4_4_]);
            __ptr = malloc((long)((iVar5 - iVar4) + 1) << 2);
            for (tempJ = 0; iVar5 = tempJ, iVar6 = Abc_NtkPiNum((Abc_Ntk_t *)nodesInLevel1_local),
                iVar5 < iVar6; tempJ = tempJ + 1) {
              bitVector2[tempJ] = 0;
              (&currInputs1->nCap)[tempJ] = 0;
            }
            for (tempJ = 0; iVar5 = tempJ, iVar6 = Vec_IntSize(iMatch2[mismatch._4_4_]),
                iVar5 < (iVar6 - iVar4) + 1; tempJ = tempJ + 1) {
              *(undefined4 *)((long)__ptr + (long)tempJ * 4) = 0;
            }
            for (tempJ = 0; iVar5 = tempJ, iVar6 = Vec_IntSize((Vec_Int_t *)FpNtk1), iVar5 < iVar6;
                tempJ = tempJ + 2) {
              iVar5 = Vec_IntEntry((Vec_Int_t *)FpNtk1,tempJ);
              iVar6 = Vec_IntEntry((Vec_Int_t *)FpNtk1,tempJ + 1);
              piVar3 = bitVector2;
              iVar7 = Vec_IntEntry((Vec_Int_t *)iGroup1_local,iVar5);
              piVar3[iVar7] = iVar6;
              iVar6 = Vec_IntEntry((Vec_Int_t *)FpNtk1,tempJ + 1);
              pVVar1 = currInputs1;
              iVar5 = Vec_IntEntry(matchedInputs2,iVar5);
              (&pVVar1->nCap)[iVar5] = iVar6;
            }
            for (tempJ = idx; iVar5 = tempJ, iVar6 = Vec_IntSize(iDep1_local[mismatch._4_4_]),
                pVVar1 = currInputs2, iVar5 < iVar6; tempJ = tempJ + 1) {
              iVar5 = Vec_IntEntry(iDep1_local[mismatch._4_4_],tempJ);
              Vec_IntPush(pVVar1,iVar5);
              pVVar2 = vSupp;
              iVar5 = Vec_IntEntry(iMatch2[mismatch._4_4_],tempJ);
              Vec_IntPush((Vec_Int_t *)pVVar2,iVar5);
            }
            for (tempJ = 0; iVar5 = tempJ, iVar6 = Abc_NtkPiNum((Abc_Ntk_t *)nodesInLevel1_local),
                iVar5 < iVar6; tempJ = tempJ + 1) {
              iVar5 = Vec_IntFind((Vec_Int_t *)iGroup1_local,tempJ);
              if (iVar5 == -1) {
                Vec_IntPushUnique(currInputs2,tempJ);
              }
              iVar5 = Vec_IntFind(matchedInputs2,tempJ);
              if (iVar5 == -1) {
                Vec_IntPushUnique((Vec_Int_t *)vSupp,tempJ);
              }
            }
            FpNtk2 = computeCofactor((Abc_Ntk_t *)nodesInLevel1_local,(Vec_Ptr_t **)iMatch1_local,
                                     bitVector2,currInputs2);
            bitVector1 = (int *)computeCofactor(pNtk2,nodesInLevel2,&currInputs1->nCap,
                                                (Vec_Int_t *)vSupp);
            for (tempJ = 0; iVar5 = tempJ, iVar6 = Abc_NtkPoNum(FpNtk2), iVar5 < iVar6;
                tempJ = tempJ + 1) {
              pAStack_e8 = Abc_NtkPo(FpNtk2,tempJ);
              pObj = (Abc_Obj_t *)Abc_NtkNodeSupport(FpNtk2,&stack0xffffffffffffff18,1);
              for (local_100 = 0; local_100 < *(int *)((long)&pObj->pNtk + 4);
                  local_100 = local_100 + 1) {
                uVar8 = Abc_ObjId((Abc_Obj_t *)(&pObj->pNext->pNtk)[local_100]);
                if (uVar8 == 1) {
                  iVar5 = Vec_IntFind(matchedOutputs1,tempJ);
                  suppNum2._4_4_ = iVar5 + 1 + suppNum2._4_4_;
                }
              }
              Vec_PtrFree((Vec_Ptr_t *)pObj);
            }
            for (tempJ = 0; iVar5 = tempJ, iVar6 = Abc_NtkPoNum((Abc_Ntk_t *)bitVector1),
                iVar5 < iVar6; tempJ = tempJ + 1) {
              pAStack_e8 = Abc_NtkPo((Abc_Ntk_t *)bitVector1,tempJ);
              pObj = (Abc_Obj_t *)
                     Abc_NtkNodeSupport((Abc_Ntk_t *)bitVector1,&stack0xffffffffffffff18,1);
              for (local_104 = 0; local_104 < *(int *)((long)&pObj->pNtk + 4);
                  local_104 = local_104 + 1) {
                uVar8 = Abc_ObjId((Abc_Obj_t *)(&pObj->pNext->pNtk)[local_104]);
                iVar5 = Vec_IntSize(iMatch2[mismatch._4_4_]);
                if (((int)(uVar8 - 1) < (iVar5 - iVar4) + 1) &&
                   (uVar8 = Abc_ObjId((Abc_Obj_t *)(&pObj->pNext->pNtk)[local_104]),
                   -1 < (int)(uVar8 - 1))) {
                  iVar5 = Vec_IntFind(matchedOutputs2,tempJ);
                  uVar8 = Abc_ObjId((Abc_Obj_t *)(&pObj->pNext->pNtk)[local_104]);
                  *(int *)((long)__ptr + (ulong)(uVar8 - 1) * 4) =
                       iVar5 + 1 + *(int *)((long)__ptr + (ulong)(uVar8 - 1) * 4);
                }
              }
              Vec_PtrFree((Vec_Ptr_t *)pObj);
            }
            for (tempJ = 0; iVar5 = tempJ, iVar6 = Vec_IntSize(iMatch2[mismatch._4_4_]),
                iVar5 < (iVar6 - iVar4) + 1; tempJ = tempJ + 1) {
              if (*(int *)((long)__ptr + (long)tempJ * 4) != suppNum2._4_4_) {
                *(undefined4 *)((long)_m + (long)(tempJ + iVar4 + -1) * 4) = 1;
              }
            }
            Abc_NtkDelete(FpNtk2);
            Abc_NtkDelete((Abc_Ntk_t *)bitVector1);
            if (bitVector2 != (int *)0x0) {
              free(bitVector2);
              bitVector2 = (int *)0x0;
            }
            if (currInputs1 != (Vec_Int_t *)0x0) {
              free(currInputs1);
              currInputs1 = (Vec_Int_t *)0x0;
            }
            Vec_IntFree(currInputs2);
            Vec_IntFree((Vec_Int_t *)vSupp);
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            if (idx != i) {
              mismatch._0_4_ = Vec_IntEntry(iMatch2[mismatch._4_4_],idx);
              pVVar1 = iMatch2[mismatch._4_4_];
              iVar5 = Vec_IntEntry(iMatch2[mismatch._4_4_],i);
              Vec_IntWriteEntry(pVVar1,idx,iVar5);
              Vec_IntWriteEntry(iMatch2[mismatch._4_4_],i,(int)mismatch);
            }
            matchNonSingletonOutputs
                      ((Abc_Ntk_t *)nodesInLevel1_local,(Vec_Ptr_t **)iMatch1_local,iDep1_local,
                       (Vec_Int_t **)matchedInputs1_local,(Vec_Int_t *)iGroup1_local,(int *)subNtk1,
                       oMatch1,oGroup1,pNtk2,nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup2,
                       oMatch2,oGroup2,matchedOutputs1,matchedOutputs2,oMatchedGroups,iNonSingleton,
                       subNtk2,(Abc_Ntk_t *)oNonSingleton,(Vec_Ptr_t *)skipList,
                       (Vec_Int_t *)oMatchPairs,0,0,ii,iVar4);
            if (idx != i) {
              mismatch._0_4_ = Vec_IntEntry(iMatch2[mismatch._4_4_],idx);
              pVVar1 = iMatch2[mismatch._4_4_];
              iVar5 = Vec_IntEntry(iMatch2[mismatch._4_4_],i);
              Vec_IntWriteEntry(pVVar1,idx,iVar5);
              Vec_IntWriteEntry(iMatch2[mismatch._4_4_],i,(int)mismatch);
            }
          }
          Vec_PtrClear((Vec_Ptr_t *)skipList);
          Abc_NtkDelete((Abc_Ntk_t *)oNonSingleton);
          Vec_IntFree((Vec_Int_t *)FpNtk1);
          if (match1by1::MATCH_FOUND == 0) {
            Vec_IntPop(matchedInputs2);
          }
        }
      }
      if ((match1by1::MATCH_FOUND == 0) && (Vec_IntPop((Vec_Int_t *)iGroup1_local), iVar4 == 1)) {
        for (tempJ = 0; iVar4 = tempJ, iVar5 = Vec_IntSize((Vec_Int_t *)oMatchPairs), iVar4 < iVar5;
            tempJ = tempJ + 1) {
          Vec_IntPop(oMatchedGroups);
        }
      }
      Vec_IntFree((Vec_Int_t *)oMatchPairs);
      Vec_PtrFree((Vec_Ptr_t *)skipList);
      if (_m != (void *)0x0) {
        free(_m);
        _m = (void *)0x0;
      }
      Abc_NtkDelete(subNtk2);
      if ((match1by1::MATCH_FOUND != 0) && (match1by1::counter != 0)) {
        match1by1::counter = 0;
      }
      pNtk1_local._4_4_ = match1by1::MATCH_FOUND;
    }
  }
  return pNtk1_local._4_4_;
}

Assistant:

int match1by1(Abc_Ntk_t * pNtk1, Vec_Ptr_t ** nodesInLevel1, Vec_Int_t ** iMatch1, Vec_Int_t ** iDep1, Vec_Int_t * matchedInputs1, int * iGroup1, Vec_Int_t ** oMatch1, int * oGroup1,
               Abc_Ntk_t * pNtk2, Vec_Ptr_t ** nodesInLevel2, Vec_Int_t ** iMatch2, Vec_Int_t ** iDep2, Vec_Int_t * matchedInputs2, int * iGroup2, Vec_Int_t ** oMatch2, int * oGroup2,
               Vec_Int_t * matchedOutputs1, Vec_Int_t * matchedOutputs2, Vec_Int_t * oMatchedGroups, Vec_Int_t * iNonSingleton, int ii, int idx)
{
    static int MATCH_FOUND = FALSE;
    Abc_Ntk_t * subNtk1, * subNtk2;
    Vec_Int_t * oNonSingleton;    
    Vec_Ptr_t * oMatchPairs;
    int * skipList;
    int j, m;    
    int i;        
    static int counter = 0;

    MATCH_FOUND = FALSE;

    if( ii == Vec_IntSize(iNonSingleton) )
    {
        MATCH_FOUND = TRUE;
        return TRUE;
    }
    
    i = Vec_IntEntry(iNonSingleton, ii);

    if( idx == Vec_IntSize(iMatch1[i]) )
    {        
        // call again with the next element in iNonSingleton
        return match1by1(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                         pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                         matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton, ii+1, 0);            
        
    }    
    
    oNonSingleton = Vec_IntAlloc(10);
    oMatchPairs = Vec_PtrAlloc(100);    
    skipList = ABC_ALLOC(int, Vec_IntSize(iMatch1[i]));

    for(j = 0; j < Vec_IntSize(iMatch1[i]); j++)
        skipList[j] = FALSE;
    
    Vec_IntPush(matchedInputs1, Vec_IntEntry(iMatch1[i], idx));
    idx++;
    
    if(idx == 1)
    {
        for(j = 0; j < Vec_IntSize(iDep1[Vec_IntEntryLast(iMatch1[i])]); j++)
        {
            if( Vec_IntSize(oMatch1[oGroup1[Vec_IntEntry(iDep1[Vec_IntEntryLast(iMatch1[i])], j)]]) == 1 ) 
                continue;
            if( Vec_IntFind( oMatchedGroups, oGroup1[Vec_IntEntry(iDep1[Vec_IntEntryLast(iMatch1[i])], j)]) != -1)
                continue;
            
            Vec_IntPushUnique(oNonSingleton,  oGroup1[Vec_IntEntry(iDep1[Vec_IntEntryLast(iMatch1[i])], j)]);
            Vec_IntPushUnique(oMatchedGroups, oGroup1[Vec_IntEntry(iDep1[Vec_IntEntryLast(iMatch1[i])], j)]);        
        }
    }

    subNtk1 = computeCofactor(pNtk1, nodesInLevel1, NULL, matchedInputs1);

    for(j = idx-1; j < Vec_IntSize(iMatch2[i]) && MATCH_FOUND == FALSE; j++)
    {
        int tempJ;
        Vec_Int_t * mismatch;

        if( skipList[j] )
            continue;

        mismatch = Vec_IntAlloc(10);

        Vec_IntPush(matchedInputs2, Vec_IntEntry(iMatch2[i], j));        
        
        subNtk2 = computeCofactor(pNtk2, nodesInLevel2, NULL, matchedInputs2);            

        for(m = 0; m < Vec_IntSize(matchedOutputs1); m++)
        {
            Vec_PtrPush(oMatchPairs, Abc_NtkPo(subNtk1, Vec_IntEntry(matchedOutputs1, m)));
            Vec_PtrPush(oMatchPairs, Abc_NtkPo(subNtk2, Vec_IntEntry(matchedOutputs2, m)));
        }

        counter++;

        if( Abc_NtkBmSat( subNtk2, subNtk1, NULL, oMatchPairs, mismatch, 0) )                
        {
            if(idx-1 != j)
            {
                tempJ = Vec_IntEntry(iMatch2[i], idx-1);
                Vec_IntWriteEntry(iMatch2[i], idx-1, Vec_IntEntry(iMatch2[i], j));
                Vec_IntWriteEntry(iMatch2[i], j, tempJ);
            }

            /*fprintf(matchFile, "%s matched to %s\n", Abc_ObjName(Abc_NtkPi(pNtk1, Vec_IntEntry(iMatch1[i], idx-1))), 
                                                      Abc_ObjName(Abc_NtkPi(pNtk2, Vec_IntEntry(iMatch2[i], j))));*/

            // we look for a match for outputs in oNonSingleton                                
            matchNonSingletonOutputs(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                                     pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                                     matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton,                         
                                     subNtk1, subNtk2, oMatchPairs, oNonSingleton, 0, 0, ii, idx);
            
            
            if(idx-1 != j)
            {
                tempJ = Vec_IntEntry(iMatch2[i], idx-1);
                Vec_IntWriteEntry(iMatch2[i], idx-1, Vec_IntEntry(iMatch2[i], j));
                Vec_IntWriteEntry(iMatch2[i], j, tempJ);
            }
        }
        else
        {
            Abc_Ntk_t * FpNtk1, * FpNtk2;
            int * bitVector1, * bitVector2;
            Vec_Int_t * currInputs1, * currInputs2;            
            Vec_Ptr_t * vSupp;    
            Abc_Obj_t * pObj;
            int suppNum1 = 0;
            int * suppNum2;            
            
            bitVector1 = ABC_ALLOC( int, Abc_NtkPiNum(pNtk1) );
            bitVector2 = ABC_ALLOC( int, Abc_NtkPiNum(pNtk2) );

            currInputs1 = Vec_IntAlloc(10);
            currInputs2 = Vec_IntAlloc(10);        
            
            suppNum2 = ABC_ALLOC(int, Vec_IntSize(iMatch2[i])-idx+1);

            for(m = 0; m < Abc_NtkPiNum(pNtk1); m++)
            {
                bitVector1[m] = 0;
                bitVector2[m] = 0;
            }

            for(m = 0; m < Vec_IntSize(iMatch2[i])-idx+1; m++)                        
                suppNum2[m]= 0;            

            // First of all set the value of the inputs that are already matched and are in mismatch
            for(m = 0; m < Vec_IntSize(mismatch); m += 2)
            {
                int n = Vec_IntEntry(mismatch, m);
                    
                bitVector1[Vec_IntEntry(matchedInputs1, n)] = Vec_IntEntry(mismatch, m+1);
                bitVector2[Vec_IntEntry(matchedInputs2, n)] = Vec_IntEntry(mismatch, m+1);
                
            }
            
            for(m = idx-1; m < Vec_IntSize(iMatch1[i]); m++)
            {
                Vec_IntPush(currInputs1, Vec_IntEntry(iMatch1[i], m));
                Vec_IntPush(currInputs2, Vec_IntEntry(iMatch2[i], m));
            }

            // Then add all the inputs that are not yet matched to the currInputs
            for(m = 0; m < Abc_NtkPiNum(pNtk1); m++)
            {
                if(Vec_IntFind( matchedInputs1, m ) == -1)
                    Vec_IntPushUnique(currInputs1, m);

                if(Vec_IntFind( matchedInputs2, m ) == -1)
                    Vec_IntPushUnique(currInputs2, m);
            }

            FpNtk1 = computeCofactor(pNtk1, nodesInLevel1, bitVector1, currInputs1);            
            FpNtk2 = computeCofactor(pNtk2, nodesInLevel2, bitVector2, currInputs2);    

            Abc_NtkForEachPo( FpNtk1, pObj, m )
            {        
                int n;
                vSupp  = Abc_NtkNodeSupport( FpNtk1, &pObj, 1 );                        
                
                for(n = 0; n < vSupp->nSize; n++)
                    if( Abc_ObjId((Abc_Obj_t *)vSupp->pArray[n]) == 1 )
                        suppNum1 += Vec_IntFind( matchedOutputs1, m) + 1;                
                        
                Vec_PtrFree( vSupp );
            }
            
            Abc_NtkForEachPo( FpNtk2, pObj, m )
            {        
                int n;
                vSupp  = Abc_NtkNodeSupport( FpNtk2, &pObj, 1 );                        
                
                for(n = 0; n < vSupp->nSize; n++)
                    if( (int)Abc_ObjId((Abc_Obj_t *)vSupp->pArray[n])-1 < (Vec_IntSize(iMatch2[i]))-idx+1 &&
                        (int)Abc_ObjId((Abc_Obj_t *)vSupp->pArray[n])-1 >= 0)
                        suppNum2[Abc_ObjId((Abc_Obj_t *)vSupp->pArray[n])-1] += Vec_IntFind( matchedOutputs2, m) + 1;                
                        
                Vec_PtrFree( vSupp );
            }

            /*if(suppNum1 != 0)            
                printf("Ntk1 is trigged");            

            if(suppNum2[0] != 0)
                printf("Ntk2 is trigged");*/

            for(m = 0; m < Vec_IntSize(iMatch2[i])-idx+1; m++)
                if(suppNum2[m] != suppNum1)
                {
                    skipList[m+idx-1] = TRUE;                    
                    /*printf("input is skipped");*/
                }
                
            Abc_NtkDelete( FpNtk1 );
            Abc_NtkDelete( FpNtk2 );
            ABC_FREE( bitVector1 );    
             ABC_FREE( bitVector2 );    
            Vec_IntFree( currInputs1 );
            Vec_IntFree( currInputs2 );            
            ABC_FREE( suppNum2 );
        }
        
        Vec_PtrClear(oMatchPairs);
        Abc_NtkDelete( subNtk2 );
        Vec_IntFree(mismatch);

        //Vec_IntWriteEntry(iMatch2[i], j, tempJ);        
        
        if( MATCH_FOUND == FALSE )
            Vec_IntPop(matchedInputs2);
    }

    if( MATCH_FOUND == FALSE )
    {
        Vec_IntPop(matchedInputs1);    
        
        if(idx == 1)
        {
            for(m = 0; m < Vec_IntSize(oNonSingleton); m++)
                Vec_IntPop( oMatchedGroups );
        }
    }
    
    Vec_IntFree( oNonSingleton );    
    Vec_PtrFree( oMatchPairs );    
    ABC_FREE( skipList );
    Abc_NtkDelete( subNtk1 );    

    if(MATCH_FOUND && counter != 0)
    {        
        /*printf("Number of INPUT SAT instances = %d\n", counter);*/

        counter = 0;
    }

    return MATCH_FOUND;
}